

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::got::got(got *this,location *where_,text *expr_,text *excpt_)

{
  allocator local_e9;
  string local_e8 [32];
  text local_c8;
  text local_a8;
  text local_88;
  location local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,"passed: got exception ",excpt_);
  std::__cxx11::string::string((string *)&local_88,(string *)&local_40);
  location::location(&local_68,where_);
  std::__cxx11::string::string((string *)&local_a8,(string *)expr_);
  std::__cxx11::string::string(local_e8,"",&local_e9);
  std::__cxx11::string::string((string *)&local_c8,local_e8);
  success::success(&this->super_success,&local_88,&local_68,&local_a8,&local_c8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  *(undefined ***)&(this->super_success).super_message = &PTR__message_00165d48;
  return;
}

Assistant:

got( location where_, text expr_, text excpt_)
    : success( "passed: got exception " + excpt_, where_, expr_) {}